

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Format.h
# Opt level: O2

void adapt::cuf::detail::Format_impl<double,double,std::__cxx11::string>
               (string *result,const_iterator *it,const_iterator *itend,double *value,double *values
               ,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *values_1)

{
  char *pcVar1;
  
  pcVar1 = it->_M_current;
  do {
    if (pcVar1 == itend->_M_current) {
      return;
    }
    if (*pcVar1 == '%') {
      it->_M_current = pcVar1 + 1;
      if (pcVar1[1] != '%') {
        if (pcVar1 + 1 != itend->_M_current) {
          AddArg<double>(result,it,itend,value);
        }
        Format_impl<double,std::__cxx11::string>(result,it,itend,values,values_1);
        return;
      }
    }
    std::__cxx11::string::push_back((char)result);
    pcVar1 = it->_M_current + 1;
    it->_M_current = pcVar1;
  } while( true );
}

Assistant:

void Format_impl(std::string& result,
				 std::string::const_iterator& it, std::string::const_iterator& itend,
				 const Value& value, const Values& ...values)
{
	while (it != itend)
	{
		switch (*it)
		{
		case '%':
			++it;
			if (*it != '%')
			{
				if (it != itend)
					AddArg(result, it, itend, value);
				return Format_impl(result, it, itend, values...);
			}
			[[fallthrough]];
		default:
			result += *it;
			++it;
		}
	}
}